

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall
Database::commit_task
          (Database *this,TaskSpec *spec,vector<DBChange,_std::allocator<DBChange>_> *changes)

{
  string_view_t fmt;
  string_view_t fmt_00;
  bool bVar1;
  ulong uVar2;
  long lVar3;
  runtime_error *prVar4;
  size_type in_RDX;
  TaskSpec *in_RSI;
  Database *in_RDI;
  optional<ConfigKey> key;
  uint64_t value;
  string keyname;
  uint64_t new_files;
  uint64_t new_bytes;
  size_t split_loc;
  string param;
  DatabaseName itname_1;
  Database *in_stack_00000230;
  DatabaseName itname;
  OnDiskDataset *ds;
  DBChange *change;
  const_iterator __end1;
  const_iterator __begin1;
  vector<DBChange,_std::allocator<DBChange>_> *__range1;
  uint64_t task_id;
  vector<DBChange,_std::allocator<DBChange>_> *in_stack_fffffffffffffc38;
  Database *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  OnDiskDataset *in_stack_fffffffffffffc50;
  path *in_stack_fffffffffffffc58;
  path *in_stack_fffffffffffffc60;
  undefined1 *in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffc80;
  Database *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffca8;
  DbChangeType in_stack_fffffffffffffcac;
  Database *in_stack_fffffffffffffcb0;
  string_view in_stack_fffffffffffffcc0;
  string local_310 [32];
  string local_2f0 [16];
  OnDiskDataset *in_stack_fffffffffffffd20;
  string local_2c8 [24];
  string *in_stack_fffffffffffffd50;
  path *in_stack_fffffffffffffd58;
  string local_298 [128];
  DatabaseName *in_stack_fffffffffffffde8;
  Database *in_stack_fffffffffffffdf0;
  undefined1 local_198 [224];
  OnDiskDataset *local_b8;
  string local_b0 [2];
  undefined1 local_70 [64];
  __normal_iterator<const_DBChange_*,_std::vector<DBChange,_std::allocator<DBChange>_>_> local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_20 [2];
  
  local_20[0]._8_8_ = in_RDX;
  local_20[0]._0_8_ = TaskSpec::id(in_RSI);
  local_28 = local_20[0]._8_8_;
  local_30._M_current =
       (DBChange *)
       std::vector<DBChange,_std::allocator<DBChange>_>::begin(in_stack_fffffffffffffc38);
  local_70._56_8_ = std::vector<DBChange,_std::allocator<DBChange>_>::end(in_stack_fffffffffffffc38)
  ;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_DBChange_*,_std::vector<DBChange,_std::allocator<DBChange>_>_>
                        *)in_stack_fffffffffffffc40,
                       (__normal_iterator<const_DBChange_*,_std::vector<DBChange,_std::allocator<DBChange>_>_>
                        *)in_stack_fffffffffffffc38);
    if (!bVar1) {
      bVar1 = std::vector<DBChange,_std::allocator<DBChange>_>::empty
                        ((vector<DBChange,_std::allocator<DBChange>_> *)in_stack_fffffffffffffc50);
      if (!bVar1) {
        save(in_stack_00000230);
      }
      erase_task(in_stack_fffffffffffffc40,(uint64_t)in_stack_fffffffffffffc38);
      return;
    }
    local_70._48_8_ =
         __gnu_cxx::
         __normal_iterator<const_DBChange_*,_std::vector<DBChange,_std::allocator<DBChange>_>_>::
         operator*(&local_30);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ::fmt::v6::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_fffffffffffffc40,
                 (char *)in_stack_fffffffffffffc38);
      in_stack_fffffffffffffc80 = local_b0;
      db_change_to_string_abi_cxx11_(in_stack_fffffffffffffcac);
      fmt_00.size_ = (size_t)in_stack_fffffffffffffc60;
      fmt_00.data_ = (char *)in_stack_fffffffffffffc58;
      spdlog::info<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (fmt_00,&in_stack_fffffffffffffc50->name,in_stack_fffffffffffffc48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc40);
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      ::fmt::v6::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)in_stack_fffffffffffffc40,
                 (char *)in_stack_fffffffffffffc38);
      in_stack_fffffffffffffc88 = (Database *)local_70;
      db_change_to_string_abi_cxx11_(in_stack_fffffffffffffcac);
      fmt.size_ = (size_t)in_stack_fffffffffffffc60;
      fmt.data_ = (char *)in_stack_fffffffffffffc58;
      spdlog::info<std::__cxx11::string,std::__cxx11::string>
                (fmt,&in_stack_fffffffffffffc50->name,in_stack_fffffffffffffc48);
      std::__cxx11::string::~string((string *)local_70);
    }
    if (*(DbChangeType *)local_70._48_8_ == Insert) {
      load_dataset(in_RDI,(string *)in_stack_fffffffffffffc88);
    }
    else if (*(DbChangeType *)local_70._48_8_ == Drop) {
      drop_dataset(in_stack_fffffffffffffcb0,
                   (string *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    }
    else if (*(DbChangeType *)local_70._48_8_ == Reload) {
      drop_dataset(in_stack_fffffffffffffcb0,
                   (string *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      load_dataset(in_RDI,(string *)in_stack_fffffffffffffc88);
    }
    else if (*(DbChangeType *)local_70._48_8_ == ToggleTaint) {
      local_b8 = find_working_dataset(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      if (local_b8 == (OnDiskDataset *)0x0) {
        spdlog::warn<char[41]>((char (*) [41])0x13681c);
      }
      else {
        OnDiskDataset::toggle_taint(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        OnDiskDataset::save(in_stack_fffffffffffffd20);
      }
    }
    else if (*(DbChangeType *)local_70._48_8_ == NewIterator) {
      in_stack_fffffffffffffc78 = local_198;
      std::experimental::filesystem::v1::__cxx11::path::path
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      DatabaseName::parse(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      std::experimental::filesystem::v1::__cxx11::path::~path(&in_stack_fffffffffffffc40->db_name);
      load_iterator(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      DatabaseName::~DatabaseName((DatabaseName *)in_stack_fffffffffffffc40);
    }
    else if (*(DbChangeType *)local_70._48_8_ == UpdateIterator) {
      std::experimental::filesystem::v1::__cxx11::path::path
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      DatabaseName::parse(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      std::experimental::filesystem::v1::__cxx11::path::~path(&in_stack_fffffffffffffc40->db_name);
      std::__cxx11::string::string(local_298,(string *)(local_70._48_8_ + 0x28));
      lVar3 = std::__cxx11::string::find((char)local_298,0x3a);
      if (lVar3 == -1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Invalid iterator update parameter");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_298);
      in_stack_fffffffffffffc60 =
           (path *)std::__cxx11::stoull
                             ((string *)in_stack_fffffffffffffc40,
                              (size_t *)in_stack_fffffffffffffc38,0);
      std::__cxx11::string::~string(local_2c8);
      in_stack_fffffffffffffd58 = in_stack_fffffffffffffc60;
      std::__cxx11::string::substr((ulong)local_2f0,(ulong)local_298);
      in_stack_fffffffffffffc58 =
           (path *)std::__cxx11::stoull
                             ((string *)in_stack_fffffffffffffc40,
                              (size_t *)in_stack_fffffffffffffc38,0);
      std::__cxx11::string::~string(local_2f0);
      update_iterator(in_RDI,(DatabaseName *)in_stack_fffffffffffffc88,
                      (uint64_t)in_stack_fffffffffffffc80,(uint64_t)in_stack_fffffffffffffc78);
      std::__cxx11::string::~string(local_298);
      DatabaseName::~DatabaseName((DatabaseName *)in_stack_fffffffffffffc40);
    }
    else {
      if (*(DbChangeType *)local_70._48_8_ != ConfigChange) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"unknown change type requested");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string(local_310,(string *)(local_70._48_8_ + 8));
      in_stack_fffffffffffffc50 =
           (OnDiskDataset *)
           std::__cxx11::stoull
                     ((string *)in_stack_fffffffffffffc40,(size_t *)in_stack_fffffffffffffc38,0);
      std::__cxx11::string::operator_cast_to_basic_string_view(local_310);
      ConfigKey::parse(in_stack_fffffffffffffcc0);
      bVar1 = std::optional::operator_cast_to_bool((optional<ConfigKey> *)0x136c62);
      if (bVar1) {
        in_stack_fffffffffffffc48 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI->config_;
        std::optional<ConfigKey>::operator*((optional<ConfigKey> *)0x136c82);
        DatabaseConfig::set((DatabaseConfig *)in_RDI,(ConfigKey *)in_stack_fffffffffffffc88,
                            (uint64_t)in_stack_fffffffffffffc80);
      }
      else {
        spdlog::error<char[36]>((char (*) [36])0x136cdd);
      }
      std::optional<ConfigKey>::~optional((optional<ConfigKey> *)0x136ceb);
      std::__cxx11::string::~string(local_310);
    }
    __gnu_cxx::
    __normal_iterator<const_DBChange_*,_std::vector<DBChange,_std::allocator<DBChange>_>_>::
    operator++(&local_30);
  } while( true );
}

Assistant:

void Database::commit_task(const TaskSpec &spec,
                           const std::vector<DBChange> &changes) {
    uint64_t task_id = spec.id();

    for (const auto &change : changes) {
        if (change.parameter.empty()) {
            spdlog::info("CHANGE: {} {}", db_change_to_string(change.type),
                         change.obj_name);
        } else {
            spdlog::info("CHANGE: {} {} ({})", db_change_to_string(change.type),
                         change.obj_name, change.parameter);
        }
        if (change.type == DbChangeType::Insert) {
            load_dataset(change.obj_name);
        } else if (change.type == DbChangeType::Drop) {
            drop_dataset(change.obj_name);
        } else if (change.type == DbChangeType::Reload) {
            drop_dataset(change.obj_name);
            load_dataset(change.obj_name);
        } else if (change.type == DbChangeType::ToggleTaint) {
            OnDiskDataset *ds = find_working_dataset(change.obj_name);
            if (ds == nullptr) {
                spdlog::warn("ToggleTaint failed - nonexistent dataset");
                continue;  // suspicious, but maybe task was delayed?
            }
            ds->toggle_taint(change.parameter);
            ds->save();
        } else if (change.type == DbChangeType::NewIterator) {
            DatabaseName itname = DatabaseName::parse(db_base, change.obj_name);
            load_iterator(itname);
        } else if (change.type == DbChangeType::UpdateIterator) {
            DatabaseName itname = DatabaseName::parse(db_base, change.obj_name);
            std::string param = change.parameter;
            size_t split_loc = param.find(':');
            if (split_loc == std::string::npos) {
                throw std::runtime_error("Invalid iterator update parameter");
            }
            uint64_t new_bytes = std::stoull(param.substr(0, split_loc));
            uint64_t new_files = std::stoull(param.substr(split_loc + 1));
            update_iterator(itname, new_bytes, new_files);
        } else if (change.type == DbChangeType::ConfigChange) {
            std::string keyname = change.obj_name;
            uint64_t value = std::stoull(change.parameter);
            auto key = ConfigKey::parse(keyname);
            if (key) {
                config_.set(*key, value);
            } else {
                spdlog::error("Invalid key name in DbChange - bug?");
            }
        } else {
            throw std::runtime_error("unknown change type requested");
        }
    }

    if (!changes.empty()) {
        save();
    }

    erase_task(task_id);
}